

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pocketsphinx.c
# Opt level: O0

int hmmdir_exists(char *path)

{
  char *__filename;
  FILE *__stream;
  char *mdef;
  FILE *tmp;
  char *path_local;
  
  __filename = string_join(path,"/means",0);
  __stream = fopen(__filename,"rb");
  if (__stream != (FILE *)0x0) {
    fclose(__stream);
  }
  ckd_free(__filename);
  return (int)(__stream != (FILE *)0x0);
}

Assistant:

static int
hmmdir_exists(const char *path)
{
    FILE *tmp;
    char *mdef = string_join(path, "/means", NULL);

    tmp = fopen(mdef, "rb");
    if (tmp) fclose(tmp);
    ckd_free(mdef);
    return (tmp != NULL);
}